

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTestCase.cpp
# Opt level: O3

void __thiscall
SuiteParserTests::readFixMessageFixture::readFixMessageFixture(readFixMessageFixture *this)

{
  long *plVar1;
  long *plVar2;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->fixMsg1)._M_dataplus._M_p = (pointer)&(this->fixMsg1).field_2;
  (this->fixMsg1)._M_string_length = 0;
  (this->fixMsg1).field_2._M_local_buf[0] = '\0';
  (this->fixMsg2)._M_dataplus._M_p = (pointer)&(this->fixMsg2).field_2;
  (this->fixMsg2)._M_string_length = 0;
  (this->fixMsg2).field_2._M_local_buf[0] = '\0';
  (this->fixMsg3)._M_dataplus._M_p = (pointer)&(this->fixMsg3).field_2;
  (this->fixMsg3)._M_string_length = 0;
  (this->fixMsg3).field_2._M_local_buf[0] = '\0';
  (this->badLength)._M_dataplus._M_p = (pointer)&(this->badLength).field_2;
  (this->badLength)._M_string_length = 0;
  (this->badLength).field_2._M_local_buf[0] = '\0';
  (this->object).m_buffer._M_dataplus._M_p = (pointer)&(this->object).m_buffer.field_2;
  (this->object).m_buffer._M_string_length = 0;
  (this->object).m_buffer.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x2c7001);
  std::__cxx11::string::_M_replace
            ((ulong)&this->fixMsg2,0,(char *)(this->fixMsg2)._M_string_length,0x2bd475);
  std::__cxx11::string::_M_replace
            ((ulong)&this->fixMsg3,0,(char *)(this->fixMsg3)._M_string_length,0x2bd49c);
  std::__cxx11::string::_M_replace
            ((ulong)&this->badLength,0,(char *)(this->badLength)._M_string_length,0x2c7084);
  std::operator+(&local_50,&this->fixMsg1,&this->fixMsg2);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_50,(ulong)(this->fixMsg3)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(this->badLength)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&this->object,(ulong)local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

readFixMessageFixture()
  {
    fixMsg1   = "8=FIX.4.2\0019=12\00135=A\001108=30\00110=31\001";
    fixMsg2   = "8=FIX.4.2\0019=17\00135=4\00136=88\001123=Y\00110=34\001";
    fixMsg3   = "8=FIX.4.2\0019=19\00135=A\001108=30\0019710=8\00110=31\001";

    badLength = "8=FIX.4.2\0019=200A\00135=A\001108=30\00110=31\001";


    object.addToStream( fixMsg1 + fixMsg2 + fixMsg3 + badLength );
  }